

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O2

void __thiscall
ThreadedReplayer::enqueue_parent_pipeline<ThreadedReplayer::DeferredComputeInfo>
          (ThreadedReplayer *this,DeferredComputeInfo *info,Hash h,
          unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
          *pipelines,
          unordered_map<unsigned_long,_ThreadedReplayer::DeferredComputeInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>_>
          *parents,unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *parsed_parents)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  Hash local_60;
  PipelineWorkItem local_58;
  
  if (h != 0) {
    local_60 = h;
    sVar1 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&pipelines->_M_h,&local_60);
    if (sVar1 == 0) {
      sVar2 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&parsed_parents->_M_h,&local_60);
      if (sVar2 == 0) {
        std::mutex::lock(&this->hash_lock);
        sVar3 = std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::count(&parents->_M_h,&local_60);
        pthread_mutex_unlock((pthread_mutex_t *)&this->hash_lock);
        if (sVar3 == 0) {
          local_58.create_info.graphics_create_info = (VkGraphicsPipelineCreateInfo *)0x0;
          local_58.output.pipeline = (VkPipeline *)0x0;
          local_58.hash_map_entry.pipeline = (VkPipeline *)0x0;
          local_58.index = info->index;
          local_58.hash = local_60;
          local_58.parse_only = true;
          local_58.force_outside_range = true;
          local_58.memory_context_index = 2;
          local_58.tag = RESOURCE_COMPUTE_PIPELINE;
          enqueue_work_item(this,&local_58);
          std::__detail::
          _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)parsed_parents,&local_60);
        }
      }
    }
  }
  return;
}

Assistant:

void enqueue_parent_pipeline(const DerivedInfo &info, Hash h,
	                             const unordered_map<Hash, VkPipeline> &pipelines,
	                             unordered_map<Hash, DerivedInfo> &parents,
	                             unordered_set<Hash> &parsed_parents)
	{
		if (!h)
			return;

		// pipelines will have an entry if we called enqueue_pipeline() already for this hash,
		// it's not necessarily complete yet!
		bool is_outside_range = pipelines.count(h) == 0;

		if (is_outside_range && parsed_parents.count(h) == 0)
		{
			{
				lock_guard<mutex> holder(hash_lock);
				if (parents.count(h) != 0)
					return;
			}

			PipelineWorkItem work_item;
			work_item.index = info.index;
			work_item.hash = h;
			work_item.parse_only = true;
			work_item.force_outside_range = true;
			work_item.memory_context_index = PARENT_PIPELINE_MEMORY_CONTEXT;
			work_item.tag = DerivedInfo::get_tag();
			enqueue_work_item(work_item);

			parsed_parents.insert(h);
		}
	}